

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O2

void drawhand(double ang,float (*v) [2],Fl_Color fill,Fl_Color line)

{
  long lVar1;
  
  fl_push_matrix();
  fl_rotate(ang);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)fill);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((double)v[lVar1][0],(double)v[lVar1][1]);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)line);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((double)v[lVar1][0],(double)v[lVar1][1]);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  fl_pop_matrix();
  return;
}

Assistant:

static void drawhand(double ang,const float v[][2],Fl_Color fill,Fl_Color line)
{
  fl_push_matrix();
  fl_rotate(ang);
  fl_color(fill);
  fl_begin_polygon();
  int i; for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_polygon();
  fl_color(line);
  fl_begin_loop();
  for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_loop();
  fl_pop_matrix();
}